

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::RegisterGeneratedSource(cmQtAutoGenInitializer *this,string *filename)

{
  cmMakefile *this_00;
  cmSourceFile *this_01;
  allocator<char> local_29;
  string local_28;
  
  this_00 = cmTarget::GetMakefile(this->Target->Target);
  this_01 = cmMakefile::GetOrCreateSource(this_00,filename,true,Ambiguous);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"GENERATED",&local_29);
  cmSourceFile::SetProperty(this_01,&local_28,"1");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"SKIP_AUTOGEN",&local_29);
  cmSourceFile::SetProperty(this_01,&local_28,"1");
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmQtAutoGenInitializer::RegisterGeneratedSource(
  std::string const& filename)
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmSourceFile* gFile = makefile->GetOrCreateSource(filename, true);
  gFile->SetProperty("GENERATED", "1");
  gFile->SetProperty("SKIP_AUTOGEN", "1");
}